

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  UnknownFieldLiteParserHelper *local_c0;
  ParseContext **local_b8;
  ParseContext *local_b0;
  ParseContext *ctx_local;
  char *ptr_local;
  UnknownFieldLiteParserHelper *pUStack_98;
  uint32_t num_local;
  UnknownFieldLiteParserHelper *this_local;
  LogMessage local_88;
  Voidify local_71;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_34;
  ParseContext *local_30;
  ParseContext *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  UnknownFieldLiteParserHelper **local_10;
  
  local_b0 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local._4_4_ = num;
  pUStack_98 = this;
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num * 8 + 3),this->unknown_);
  }
  this_00 = local_b0;
  local_34 = ptr_local._4_4_ * 8 + 3;
  local_b8 = &local_b0;
  local_28 = local_b0;
  local_30 = ctx_local;
  _old_group_depth = &local_c0;
  iVar2 = local_b0->depth_ + -1;
  local_b0->depth_ = iVar2;
  local_c0 = this;
  if (iVar2 < 0) {
    local_20 = (ParseContext *)0x0;
  }
  else {
    local_b0->group_depth_ = local_b0->group_depth_ + 1;
    absl_log_internal_check_op_result._4_4_ = local_b0->depth_;
    absl_log_internal_check_op_result._0_4_ = local_b0->group_depth_;
    local_18 = ctx_local;
    local_10 = _old_group_depth;
    local_30 = (ParseContext *)
               WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                         (this,(char *)ctx_local,local_b0);
    if (local_30 != (ParseContext *)0x0) {
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._4_4_);
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this_00->depth_);
      local_50 = absl::lts_20250127::log_internal::Check_EQImpl(iVar2,iVar3,"old_depth == depth_");
      if (local_50 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x491,pcVar4);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&absl_log_internal_check_op_result_1);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
      }
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                        ((int)absl_log_internal_check_op_result);
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this_00->group_depth_);
      local_70 = absl::lts_20250127::log_internal::Check_EQImpl
                           (iVar2,iVar3,"old_group_depth == group_depth_");
      if (local_70 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x492,pcVar4);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_88);
      }
      local_70 = (Nullable<const_char_*>)0x0;
    }
    this_00->group_depth_ = this_00->group_depth_ + -1;
    this_00->depth_ = this_00->depth_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this_00->super_EpsCopyInputStream,local_34);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_20 = local_30;
    }
    else {
      local_20 = (ParseContext *)0x0;
    }
  }
  ctx_local = local_20;
  if (local_20 == (ParseContext *)0x0) {
    this_local = (UnknownFieldLiteParserHelper *)0x0;
  }
  else {
    if (this->unknown_ != (string *)0x0) {
      WriteVarint((ulong)(ptr_local._4_4_ * 8 + 4),this->unknown_);
    }
    this_local = (UnknownFieldLiteParserHelper *)ctx_local;
  }
  return (char *)this_local;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }